

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigpipe.h
# Opt level: O0

void sigpipe_ignore(Curl_easy *data,sigpipe_ignore *ig)

{
  _union_1457 local_b0;
  sigaction action;
  sigpipe_ignore *ig_local;
  Curl_easy *data_local;
  
  ig->no_signal = (*(ulong *)&(data->set).field_0x978 >> 0x22 & 1) != 0;
  if ((*(ulong *)&(data->set).field_0x978 >> 0x22 & 1) == 0) {
    action.sa_restorer = (_func_void *)ig;
    memset(ig,0,0x98);
    sigaction(0xd,(sigaction *)0x0,(sigaction *)action.sa_restorer);
    memcpy(&local_b0,action.sa_restorer,0x98);
    local_b0 = (_union_1457)0x1;
    sigaction(0xd,(sigaction *)&local_b0,(sigaction *)0x0);
  }
  return;
}

Assistant:

static void sigpipe_ignore(struct Curl_easy *data,
                           struct sigpipe_ignore *ig)
{
  /* get a local copy of no_signal because the Curl_easy might not be
     around when we restore */
  ig->no_signal = data->set.no_signal;
  if(!data->set.no_signal) {
    struct sigaction action;
    /* first, extract the existing situation */
    memset(&ig->old_pipe_act, 0, sizeof(struct sigaction));
    sigaction(SIGPIPE, NULL, &ig->old_pipe_act);
    action = ig->old_pipe_act;
    /* ignore this signal */
    action.sa_handler = SIG_IGN;
    sigaction(SIGPIPE, &action, NULL);
  }
}